

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O2

ggml_tensor *
ggml_soft_max_impl(ggml_context *ctx,ggml_tensor *a,ggml_tensor *mask,float scale,float max_bias,
                  _Bool inplace)

{
  _Bool _Var1;
  ggml_tensor *tensor;
  char *pcVar2;
  int line;
  float params [2];
  
  _Var1 = ggml_is_contiguous_0(a);
  if (_Var1) {
    if (mask == (ggml_tensor *)0x0) {
      if (max_bias <= 0.0) {
LAB_00122566:
        if (inplace) {
          tensor = ggml_view_tensor(ctx,a);
        }
        else {
          tensor = ggml_dup_tensor(ctx,a);
        }
        params[0] = scale;
        params[1] = max_bias;
        ggml_set_op_params(tensor,params,8);
        tensor->op = GGML_OP_SOFT_MAX;
        tensor->src[0] = a;
        tensor->src[1] = mask;
        return tensor;
      }
      pcVar2 = "mask";
      line = 0xd8a;
    }
    else if (mask->type < GGML_TYPE_Q4_0) {
      _Var1 = ggml_is_contiguous_0(mask);
      if (_Var1) {
        if ((mask->ne[2] == 1) && (mask->ne[3] == 1)) {
          if (mask->ne[0] == a->ne[0]) {
            if (a->ne[1] <= mask->ne[1]) goto LAB_00122566;
            pcVar2 = "mask->ne[1] >= a->ne[1]";
            line = 0xd86;
          }
          else {
            pcVar2 = "mask->ne[0] == a->ne[0]";
            line = 0xd85;
          }
        }
        else {
          pcVar2 = "ggml_is_matrix(mask)";
          line = 0xd84;
        }
      }
      else {
        pcVar2 = "ggml_is_contiguous(mask)";
        line = 0xd83;
      }
    }
    else {
      pcVar2 = "mask->type == GGML_TYPE_F16 || mask->type == GGML_TYPE_F32";
      line = 0xd82;
    }
  }
  else {
    pcVar2 = "ggml_is_contiguous(a)";
    line = 0xd7f;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",line,
             "GGML_ASSERT(%s) failed",pcVar2);
}

Assistant:

static struct ggml_tensor * ggml_soft_max_impl(
        struct ggml_context * ctx,
        struct ggml_tensor  * a,
        struct ggml_tensor  * mask,
        float                 scale,
        float                 max_bias,
        bool                  inplace) {
    GGML_ASSERT(ggml_is_contiguous(a));

    if (mask) {
        GGML_ASSERT(mask->type == GGML_TYPE_F16 || mask->type == GGML_TYPE_F32);
        GGML_ASSERT(ggml_is_contiguous(mask));
        GGML_ASSERT(ggml_is_matrix(mask));
        GGML_ASSERT(mask->ne[0] == a->ne[0]);
        GGML_ASSERT(mask->ne[1] >= a->ne[1]);
    }

    if (max_bias > 0.0f) {
        GGML_ASSERT(mask);
    }

    struct ggml_tensor * result = inplace ? ggml_view_tensor(ctx, a) : ggml_dup_tensor(ctx, a);

    float params[] = { scale, max_bias };
    ggml_set_op_params(result, params, sizeof(params));

    result->op     = GGML_OP_SOFT_MAX;
    result->src[0] = a;
    result->src[1] = mask;

    return result;
}